

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  long lVar3;
  uint *puVar4;
  IStream *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  ArgExc *pAVar9;
  uint *puVar10;
  Array2D<unsigned_int> *sampleCountBuffer;
  long lVar11;
  int iVar12;
  long lVar13;
  stringstream _iex_replace_s;
  
  if (this->_data->frameBufferValid == false) {
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar9,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar9,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  iVar7 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  iVar6 = scanline1;
  if (scanline2 < scanline1) {
    iVar6 = scanline2;
  }
  if (this->_data->minY <= iVar6) {
    iVar12 = scanline2;
    if (scanline2 < scanline1) {
      iVar12 = scanline1;
    }
    if (iVar12 <= this->_data->maxY) {
      iVar12 = scanline1;
      if (scanline2 < scanline1) {
        iVar12 = scanline2;
      }
      lVar13 = (long)iVar12;
      do {
        pDVar2 = this->_data;
        if (pDVar2->bigFile == true) {
          iVar12 = pDVar2->minY;
LAB_00163248:
          iVar8 = ((int)lVar13 - iVar12) / pDVar2->linesInBuffer;
          sampleCountBuffer = &pDVar2->sampleCount;
          if (pDVar2->bigFile != false) {
            sampleCountBuffer = (Array2D<unsigned_int> *)0x0;
          }
          anon_unknown_0::readSampleCountForLineBlock
                    (pDVar2->_streamData,pDVar2,iVar8,sampleCountBuffer,iVar12,true);
          pDVar2 = this->_data;
          iVar8 = iVar8 * pDVar2->linesInBuffer + pDVar2->minY;
          iVar12 = pDVar2->linesInBuffer + iVar8 + -1;
          if (pDVar2->maxY < iVar12) {
            iVar12 = pDVar2->maxY;
          }
          bytesPerDeepLineTable
                    (&pDVar2->header,iVar8,iVar12,pDVar2->sampleCountSliceBase,
                     pDVar2->sampleCountXStride,pDVar2->sampleCountYStride,&pDVar2->bytesPerLine);
          pDVar2 = this->_data;
          offsetInLineBufferTable
                    (&pDVar2->bytesPerLine,iVar8 - pDVar2->minY,iVar12 - pDVar2->minY,
                     pDVar2->linesInBuffer,&pDVar2->offsetInLineBuffer);
        }
        else {
          iVar12 = pDVar2->minY;
          if ((pDVar2->gotSampleCount)._data[lVar13 - iVar12] != true) goto LAB_00163248;
          iVar8 = pDVar2->minX;
          if (iVar8 <= pDVar2->maxX) {
            iVar1 = pDVar2->sampleCountXStride;
            lVar11 = (long)iVar8 + -1;
            puVar10 = (uint *)(pDVar2->sampleCountSliceBase +
                              (long)iVar8 * (long)iVar1 + pDVar2->sampleCountYStride * lVar13);
            lVar3 = (pDVar2->sampleCount)._sizeY;
            puVar4 = (pDVar2->sampleCount)._data;
            do {
              *puVar10 = puVar4[(lVar13 - iVar12) * lVar3 + ((lVar11 + 1) - (long)pDVar2->minX)];
              lVar11 = lVar11 + 1;
              puVar10 = (uint *)((long)puVar10 + (long)iVar1);
            } while (lVar11 < pDVar2->maxX);
          }
        }
        lVar13 = lVar13 + 1;
        if (((scanline1 + scanline2) - iVar6) + 1 == (int)lVar13) {
          pIVar5 = this->_data->_streamData->is;
          (*pIVar5->_vptr_IStream[6])(pIVar5,CONCAT44(extraout_var,iVar7));
          pthread_mutex_unlock(__mutex);
          return;
        }
      } while( true );
    }
  }
  pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc
            (pAVar9,"Tried to read scan line sample counts outside the image file\'s data window.");
  __cxa_throw(pAVar9,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    uint64_t savedFilePos = 0;

    if (!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc (
            "readPixelSampleCounts called with no valid frame buffer");
    }

    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        savedFilePos = _data->_streamData->is->tellg ();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc (
                "Tried to read scan line sample counts outside "
                "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, and file is small enough to cache, count data will be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (!_data->bigFile && _data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache (i, _data);
            }
            else
            {

                int lineBlockId = (i - _data->minY) / _data->linesInBuffer;

                //
                // read samplecount data into external buffer
                // also cache to internal buffer unless in bigFile mode
                //
                readSampleCountForLineBlock (
                    _data->_streamData,
                    _data,
                    lineBlockId,
                    _data->bigFile ? nullptr : &_data->sampleCount,
                    _data->minY,
                    true);

                int minYInLineBuffer =
                    lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min (
                    minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY);

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable (
                    _data->header,
                    minYInLineBuffer,
                    maxYInLineBuffer,
                    _data->sampleCountSliceBase,
                    _data->sampleCountXStride,
                    _data->sampleCountYStride,
                    _data->bytesPerLine);

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable (
                    _data->bytesPerLine,
                    minYInLineBuffer - _data->minY,
                    maxYInLineBuffer - _data->minY,
                    _data->linesInBuffer,
                    _data->offsetInLineBuffer);
            }
        }

        _data->_streamData->is->seekg (savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading sample count data from image "
            "file \""
                << fileName () << "\". " << e.what ());

        _data->_streamData->is->seekg (savedFilePos);

        throw;
    }
}